

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(ze_device_properties_t val)

{
  ostream *poVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  string *in_RDI;
  stringstream ss;
  ze_structure_type_t in_stack_00000008;
  ze_device_type_t in_stack_00000018;
  uint in_stack_0000001c;
  uint in_stack_00000020;
  ze_device_property_flag_t in_stack_00000024;
  uint in_stack_00000028;
  uint in_stack_0000002c;
  ulong in_stack_00000030;
  uint in_stack_00000038;
  uint in_stack_0000003c;
  uint in_stack_00000040;
  uint in_stack_00000044;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  uint in_stack_00000050;
  ulong in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  uint auStackY_1b0 [22];
  ios_base local_158 [16];
  ze_device_uuid_t in_stack_fffffffffffffeb8;
  long *local_50;
  long local_40 [2];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1d8,in_stack_00000008);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != (ostream *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  poVar1 = (ostream *)(local_1d8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0x",2);
  *(uint *)((long)auStackY_1b0 + *(long *)(local_1c8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStackY_1b0 + *(long *)(local_1c8._M_allocated_capacity - 0x18)) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1d8,in_stack_00000018);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000001c) {
    uVar6 = in_stack_0000001c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106381;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106381;
      }
      if (uVar6 < 10000) goto LAB_00106381;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106381:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000001c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000020) {
    uVar6 = in_stack_00000020;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106436;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106436;
      }
      if (uVar6 < 10000) goto LAB_00106436;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106436:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000020);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_1d8,in_stack_00000024);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000028) {
    uVar6 = in_stack_00000028;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010653c;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010653c;
      }
      if (uVar6 < 10000) goto LAB_0010653c;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010653c:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000028);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000002c) {
    uVar6 = in_stack_0000002c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001065f1;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001065f1;
      }
      if (uVar6 < 10000) goto LAB_001065f1;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001065f1:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000002c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000030) {
    uVar5 = in_stack_00000030;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001066b2;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001066b2;
      }
      if (uVar5 < 10000) goto LAB_001066b2;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001066b2:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000030);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000038) {
    uVar6 = in_stack_00000038;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106768;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106768;
      }
      if (uVar6 < 10000) goto LAB_00106768;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106768:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000038);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000003c) {
    uVar6 = in_stack_0000003c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010681d;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010681d;
      }
      if (uVar6 < 10000) goto LAB_0010681d;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010681d:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000003c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000040) {
    uVar6 = in_stack_00000040;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001068d2;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001068d2;
      }
      if (uVar6 < 10000) goto LAB_001068d2;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001068d2:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000040);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000044) {
    uVar6 = in_stack_00000044;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106987;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106987;
      }
      if (uVar6 < 10000) goto LAB_00106987;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106987:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000044);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000048) {
    uVar6 = in_stack_00000048;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106a3c;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106a3c;
      }
      if (uVar6 < 10000) goto LAB_00106a3c;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106a3c:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000048);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_0000004c) {
    uVar6 = in_stack_0000004c;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106af1;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106af1;
      }
      if (uVar6 < 10000) goto LAB_00106af1;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106af1:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_0000004c);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000050) {
    uVar6 = in_stack_00000050;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106ba6;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106ba6;
      }
      if (uVar6 < 10000) goto LAB_00106ba6;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106ba6:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000050);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000058) {
    uVar5 = in_stack_00000058;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106c67;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106c67;
      }
      if (uVar5 < 10000) goto LAB_00106c67;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106c67:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000058);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000060) {
    uVar6 = in_stack_00000060;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106d1d;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106d1d;
      }
      if (uVar6 < 10000) goto LAB_00106d1d;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106d1d:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000060);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  cVar4 = '\x01';
  if (9 < in_stack_00000064) {
    uVar6 = in_stack_00000064;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00106dd2;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00106dd2;
      }
      if (uVar6 < 10000) goto LAB_00106dd2;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00106dd2:
  local_1d8._0_8_ = poVar1;
  std::__cxx11::string::_M_construct((ulong)local_1d8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1d8._0_8_,local_1d8._8_4_,in_stack_00000064);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_(in_stack_fffffffffffffeb8);
  std::__cxx11::string::_M_append((char *)in_RDI,local_1d8._0_8_);
  if ((ostream *)local_1d8._0_8_ != poVar1) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string(const ze_device_properties_t val)
{
    std::string str;
    
    str += "Device::properties_t::stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "Device::properties_t::pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "Device::properties_t::type : ";
    str += to_string(val.type);
    str += "\n";
    
    str += "Device::properties_t::vendorId : ";
    str += std::to_string(val.vendorId);
    str += "\n";
    
    str += "Device::properties_t::deviceId : ";
    str += std::to_string(val.deviceId);
    str += "\n";
    
    str += "Device::properties_t::flags : ";
    str += to_string((ze_device_property_flag_t)val.flags);
    str += "\n";
    
    str += "Device::properties_t::subdeviceId : ";
    str += std::to_string(val.subdeviceId);
    str += "\n";
    
    str += "Device::properties_t::coreClockRate : ";
    str += std::to_string(val.coreClockRate);
    str += "\n";
    
    str += "Device::properties_t::maxMemAllocSize : ";
    str += std::to_string(val.maxMemAllocSize);
    str += "\n";
    
    str += "Device::properties_t::maxHardwareContexts : ";
    str += std::to_string(val.maxHardwareContexts);
    str += "\n";
    
    str += "Device::properties_t::maxCommandQueuePriority : ";
    str += std::to_string(val.maxCommandQueuePriority);
    str += "\n";
    
    str += "Device::properties_t::numThreadsPerEU : ";
    str += std::to_string(val.numThreadsPerEU);
    str += "\n";
    
    str += "Device::properties_t::physicalEUSimdWidth : ";
    str += std::to_string(val.physicalEUSimdWidth);
    str += "\n";
    
    str += "Device::properties_t::numEUsPerSubslice : ";
    str += std::to_string(val.numEUsPerSubslice);
    str += "\n";
    
    str += "Device::properties_t::numSubslicesPerSlice : ";
    str += std::to_string(val.numSubslicesPerSlice);
    str += "\n";
    
    str += "Device::properties_t::numSlices : ";
    str += std::to_string(val.numSlices);
    str += "\n";
    
    str += "Device::properties_t::timerResolution : ";
    str += std::to_string(val.timerResolution);
    str += "\n";
    
    str += "Device::properties_t::timestampValidBits : ";
    str += std::to_string(val.timestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::kernelTimestampValidBits : ";
    str += std::to_string(val.kernelTimestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::uuid : ";
    str += to_string(val.uuid);
    str += "\n";
    
    str += "Device::properties_t::name : ";
    str += val.name;
    str += "\n";

    return str;
}